

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namer.h
# Opt level: O2

string * __thiscall
flatbuffers::Namer::Denamespace
          (string *__return_storage_ptr__,Namer *this,string *s,string *namespace_prefix,
          char delimiter)

{
  long lVar1;
  undefined3 in_register_00000081;
  string asStack_48 [32];
  
  lVar1 = std::__cxx11::string::rfind((char)s,(ulong)CONCAT31(in_register_00000081,delimiter));
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)namespace_prefix);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::__cxx11::string::substr((ulong)asStack_48,(ulong)s);
    std::__cxx11::string::operator=((string *)namespace_prefix,asStack_48);
    std::__cxx11::string::~string(asStack_48);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Denamespace(const std::string &s,
                                  std::string &namespace_prefix,
                                  const char delimiter = '.') const {
    const size_t pos = s.find_last_of(delimiter);
    if (pos == std::string::npos) {
      namespace_prefix = "";
      return s;
    }
    namespace_prefix = s.substr(0, pos);
    return s.substr(pos + 1);
  }